

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::BoolOption::help(BoolOption *this,bool verbose)

{
  size_t sVar1;
  char *pcVar2;
  byte in_SIL;
  long in_RDI;
  uint32_t i;
  uint local_10;
  
  fprintf(_stderr,"  -%s, -no-%s",*(undefined8 *)(in_RDI + 8),*(undefined8 *)(in_RDI + 8));
  local_10 = 0;
  while( true ) {
    sVar1 = strlen(*(char **)(in_RDI + 8));
    if (sVar1 * -2 + 0x20 <= (ulong)local_10) break;
    fprintf(_stderr," ");
    local_10 = local_10 + 1;
  }
  fprintf(_stderr," ");
  pcVar2 = "off";
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    pcVar2 = "on";
  }
  fprintf(_stderr,"(default: %s)\n",pcVar2);
  if ((in_SIL & 1) != 0) {
    fprintf(_stderr,"\n        %s\n",*(undefined8 *)(in_RDI + 0x10));
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

virtual void help(bool verbose = false)
    {

        fprintf(stderr, "  -%s, -no-%s", name, name);

        for (uint32_t i = 0; i < 32 - strlen(name) * 2; i++) fprintf(stderr, " ");

        fprintf(stderr, " ");
        fprintf(stderr, "(default: %s)\n", value ? "on" : "off");
        if (verbose) {
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }